

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdnode.cc
# Opt level: O0

void __thiscall
bdNode::msgout_reply_hash
          (bdNode *this,bdId *id,bdToken *transId,bdToken *token,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *values)

{
  int len;
  int blen;
  int avail;
  char msg [10240];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *values_local;
  bdToken *token_local;
  bdToken *transId_local;
  bdId *id_local;
  bdNode *this_local;
  
  registerOutgoingMsg(this,id,transId,6,(bdNodeId *)0x0);
  len = bitdht_peers_reply_hash_msg(transId,&this->mOwnId,token,values,(char *)&blen,0x27ff);
  sendPkt(this,(char *)&blen,len,id->addr);
  bdAccount::incCounter(&this->mAccount,6,true);
  return;
}

Assistant:

void bdNode::msgout_reply_hash(bdId *id, bdToken *transId, bdToken *token, std::list<std::string> &values) {
#ifdef DEBUG_NODE_MSGOUT
	std::cerr << "bdNode::msgout_reply_hash() TransId: ";
	bdPrintTransId(std::cerr, transId);
	std::cerr << " To: ";
	mFns->bdPrintId(std::cerr, id);
	std::cerr << " Token: ";
	bdPrintToken(std::cerr, token);

	std::cerr << " Peers: ";
	std::list<std::string>::iterator it;
	for (it = values.begin(); it != values.end(); it++) {
		std::cerr << " ";
		bdPrintCompactPeerId(std::cerr, *it);
	}
	std::cerr << std::endl;
#endif

    char msg[10240];
    int avail = 10240;

	registerOutgoingMsg(id, transId, BITDHT_MSG_TYPE_REPLY_HASH, NULL);

    int blen = bitdht_peers_reply_hash_msg(transId, &(mOwnId), token, values, msg, avail-1);
    sendPkt(msg, blen, id->addr);

	mAccount.incCounter(BDACCOUNT_MSG_REPLYQUERYHASH, true);
}